

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O3

void __thiscall UnifiedRegex::DebugWriter::PrintQuotedChar(DebugWriter *this,Char c)

{
  if (this->nlPending == true) {
    Output::Print(L"\n%*s",(ulong)(uint)(this->indent << 2),L"");
    this->nlPending = false;
  }
  Output::Print(L"\'");
  if (c == L'\'') {
    Output::Print(L"\\\'");
  }
  else {
    PrintEscapedChar(this,c);
  }
  Output::Print(L"\'");
  return;
}

Assistant:

void DebugWriter::PrintQuotedChar(const Char c)
    {
        CheckForNewline();
        Output::Print(_u("'"));
        if (c == '\'')
            Output::Print(_u("\\'"));
        else
            PrintEscapedChar(c);
        Output::Print(_u("'"));
    }